

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O2

string * __thiscall
spvtools::opt::analysis::RuntimeArray::str_abi_cxx11_
          (string *__return_storage_ptr__,RuntimeArray *this)

{
  ostream *poVar1;
  ostringstream oss;
  string asStack_1b8 [32];
  ostringstream local_198 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  poVar1 = std::operator<<((ostream *)local_198,"[");
  (*this->element_type_->_vptr_Type[3])(asStack_1b8);
  poVar1 = std::operator<<(poVar1,asStack_1b8);
  std::operator<<(poVar1,"]");
  std::__cxx11::string::_M_dispose();
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return __return_storage_ptr__;
}

Assistant:

std::string RuntimeArray::str() const {
  std::ostringstream oss;
  oss << "[" << element_type_->str() << "]";
  return oss.str();
}